

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZCompMesh> * __thiscall
TPZAutoPointer<TPZCompMesh>::operator=
          (TPZAutoPointer<TPZCompMesh> *this,TPZMultiphysicsCompMesh *other)

{
  bool bVar1;
  TPZCompMesh *pTVar2;
  TPZCompMesh *in_RSI;
  TPZReference *in_RDI;
  TPZAutoPointer<TPZCompMesh> *in_stack_ffffffffffffffd0;
  TPZReference *this_00;
  
  this_00 = in_RDI;
  if ((in_RDI->fPointer != (TPZCompMesh *)0x0) && (bVar1 = TPZReference::Decrease(in_RDI), bVar1)) {
    Release(in_stack_ffffffffffffffd0);
  }
  pTVar2 = (TPZCompMesh *)operator_new(0x10);
  TPZReference::TPZReference(this_00,in_RSI);
  in_RDI->fPointer = pTVar2;
  return (TPZAutoPointer<TPZCompMesh> *)in_RDI;
}

Assistant:

TPZAutoPointer &operator=(T2 *other)
    {
        if constexpr (!std::is_base_of_v<T, T2>){
            static_assert(!sizeof(T2*),"Incompatible types when creating TPZAutoPointer");
        }
        if (fRef && fRef->Decrease()){
            Release();
        }
        fRef = new TPZReference(other);
        return *this;
    }